

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O3

void __thiscall Nes_Triangle::clock_linear_counter(Nes_Triangle *this)

{
  byte bVar1;
  
  if ((this->super_Nes_Osc).reg_written[3] == true) {
    bVar1 = (this->super_Nes_Osc).regs[0];
    this->linear_counter = bVar1 & 0x7f;
  }
  else {
    if (this->linear_counter != 0) {
      this->linear_counter = this->linear_counter + -1;
    }
    bVar1 = (this->super_Nes_Osc).regs[0];
  }
  if (-1 < (char)bVar1) {
    (this->super_Nes_Osc).reg_written[3] = false;
  }
  return;
}

Assistant:

void Nes_Triangle::clock_linear_counter()
{
	if ( reg_written [3] )
		linear_counter = regs [0] & 0x7F;
	else if ( linear_counter )
		linear_counter--;
	
	if ( !(regs [0] & 0x80) )
		reg_written [3] = false;
}